

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O2

void __thiscall chrono::ChNodeSPH::ArchiveIN(ChNodeSPH *this)

{
  ChArchiveIn *in_RSI;
  
  ArchiveIN((ChNodeSPH *)
            ((long)(this->super_ChNodeXYZ).pos.m_data +
            *(long *)((long)(this->super_ChNodeXYZ).super_ChLoadableUVW + -0xc0) + -8),in_RSI);
  return;
}

Assistant:

void ChNodeSPH::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChNodeSPH>();

    // deserialize parent class
    ChNodeXYZ::ArchiveIN(marchive);

    // deserialize all member data:
    // marchive >> CHNVP(container);
    marchive >> CHNVP(collision_model);
    marchive >> CHNVP(UserForce);
    marchive >> CHNVP(volume);
    marchive >> CHNVP(density);
    marchive >> CHNVP(h_rad);
    marchive >> CHNVP(coll_rad);
    marchive >> CHNVP(pressure);
}